

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkDepends.cxx
# Opt level: O2

vector<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_> *
__thiscall cmComputeLinkDepends::Compute(cmComputeLinkDepends *this)

{
  _Elt_pointer pBVar1;
  SharedDepEntry *dep;
  _Base_ptr p_Var2;
  BFSEntry qe;
  map<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
  *pmVar3;
  FILE *__stream;
  bool bVar4;
  __type _Var5;
  PolicyStatus PVar6;
  cmValue cVar7;
  cmake *pcVar8;
  _Base_ptr p_Var9;
  iterator __position;
  iterator __rhs;
  cmGeneratorTarget *pcVar10;
  string *psVar11;
  char *pcVar12;
  PolicyID id;
  PolicyID id_00;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  __tmp_2;
  size_type sVar13;
  value_type *__x;
  reverse_iterator<__gnu_cxx::__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  __end0;
  pointer puVar14;
  long lVar15;
  reverse_iterator<__gnu_cxx::__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  __begin0;
  cmMakefile *s;
  _Base_ptr p_Var16;
  pointer puVar17;
  long lVar18;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  __tmp;
  LinkEntry *pLVar19;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  init;
  pair<std::_Rb_tree_iterator<unsigned_long>,_bool> pVar20;
  char local_349;
  cmMakefile *local_348;
  cmComputeLinkDepends *local_340;
  cmGeneratorTarget *local_338;
  string errorMessage;
  undefined1 local_310 [32];
  EntriesProcessing entriesProcessing;
  undefined1 local_2a0 [64];
  RegularExpression processingOption;
  
  AddDirectLinkEntries(this);
  while (pBVar1 = (this->BFSQueue).c.
                  super__Deque_base<cmComputeLinkDepends::BFSEntry,_std::allocator<cmComputeLinkDepends::BFSEntry>_>
                  ._M_impl.super__Deque_impl_data._M_start._M_cur,
        (this->BFSQueue).c.
        super__Deque_base<cmComputeLinkDepends::BFSEntry,_std::allocator<cmComputeLinkDepends::BFSEntry>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_cur != pBVar1) {
    local_2a0._56_8_ = pBVar1->LibDepends;
    local_2a0._40_8_ = pBVar1->Index;
    local_2a0._48_8_ = pBVar1->GroupIndex;
    std::deque<cmComputeLinkDepends::BFSEntry,_std::allocator<cmComputeLinkDepends::BFSEntry>_>::
    pop_front(&(this->BFSQueue).c);
    qe.GroupIndex = local_2a0._48_8_;
    qe.Index = local_2a0._40_8_;
    qe.LibDepends = (char *)local_2a0._56_8_;
    FollowLinkEntry(this,qe);
  }
  while (dep = (this->SharedDepQueue).c.
               super__Deque_base<cmComputeLinkDepends::SharedDepEntry,_std::allocator<cmComputeLinkDepends::SharedDepEntry>_>
               ._M_impl.super__Deque_impl_data._M_start._M_cur,
        (this->SharedDepQueue).c.
        super__Deque_base<cmComputeLinkDepends::SharedDepEntry,_std::allocator<cmComputeLinkDepends::SharedDepEntry>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_cur != dep) {
    HandleSharedDependency(this,dep);
    std::
    deque<cmComputeLinkDepends::SharedDepEntry,_std::allocator<cmComputeLinkDepends::SharedDepEntry>_>
    ::pop_front(&(this->SharedDepQueue).c);
  }
  InferDependencies(this);
  UpdateGroupDependencies(this);
  CleanConstraintGraph(this);
  if (this->DebugMode == true) {
    fwrite("------------------------------------------------------------------------------\n",0x4f,1
           ,_stderr);
    __stream = _stderr;
    psVar11 = cmGeneratorTarget::GetName_abi_cxx11_(this->Target);
    if (this->HasConfig == false) {
      pcVar12 = "noconfig";
    }
    else {
      pcVar12 = (this->Config)._M_dataplus._M_p;
    }
    fprintf(__stream,"Link dependency analysis for target %s, config %s\n",
            (psVar11->_M_dataplus)._M_p,pcVar12);
    DisplayConstraintGraph(this);
  }
  std::make_unique<cmComputeComponentGraph,cmGraphAdjacencyList&>
            ((cmGraphAdjacencyList *)&processingOption);
  pcVar12 = processingOption.regmatch.startp[0];
  processingOption.regmatch.startp[0] = (char *)0x0;
  std::__uniq_ptr_impl<cmComputeComponentGraph,_std::default_delete<cmComputeComponentGraph>_>::
  reset((__uniq_ptr_impl<cmComputeComponentGraph,_std::default_delete<cmComputeComponentGraph>_> *)
        &this->CCG,(pointer)pcVar12);
  std::unique_ptr<cmComputeComponentGraph,_std::default_delete<cmComputeComponentGraph>_>::
  ~unique_ptr((unique_ptr<cmComputeComponentGraph,_std::default_delete<cmComputeComponentGraph>_> *)
              &processingOption);
  cmComputeComponentGraph::Compute
            ((this->CCG)._M_t.
             super___uniq_ptr_impl<cmComputeComponentGraph,_std::default_delete<cmComputeComponentGraph>_>
             ._M_t.
             super__Tuple_impl<0UL,_cmComputeComponentGraph_*,_std::default_delete<cmComputeComponentGraph>_>
             .super__Head_base<0UL,_cmComputeComponentGraph_*,_false>._M_head_impl);
  bVar4 = CheckCircularDependencies(this);
  if (!bVar4) {
    return &this->FinalLinkEntries;
  }
  OrderLinkEntries(this);
  local_338 = this->Target;
  entriesProcessing.Entries = &this->EntryList;
  entriesProcessing.FinalEntries = &this->FinalLinkEntries;
  entriesProcessing.Emitted._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &entriesProcessing.Emitted._M_t._M_impl.super__Rb_tree_header._M_header;
  entriesProcessing.Order = Reverse;
  entriesProcessing.Unicity = Shared;
  entriesProcessing.Emitted._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  entriesProcessing.Emitted._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  entriesProcessing.Emitted._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  entriesProcessing.Groups =
       (map<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
        *)0x0;
  local_348 = local_338->Makefile;
  local_340 = this;
  entriesProcessing.Emitted._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       entriesProcessing.Emitted._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_2a0._32_8_ = entriesProcessing.FinalEntries;
  PVar6 = cmGeneratorTarget::GetPolicyStatusCMP0156(local_338);
  if (PVar6 - REQUIRED_IF_USED < 2) {
    pcVar8 = cmMakefile::GetCMakeInstance(local_348);
    cmPolicies::GetRequiredPolicyError_abi_cxx11_((string *)&processingOption,(cmPolicies *)0x9c,id)
    ;
    cmGeneratorTarget::GetBacktrace((cmGeneratorTarget *)&errorMessage);
    cmake::IssueMessage(pcVar8,FATAL_ERROR,(string *)&processingOption,
                        (cmListFileBacktrace *)&errorMessage);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&errorMessage._M_string_length);
    std::__cxx11::string::~string((string *)&processingOption);
  }
  else {
    if (PVar6 == WARN) {
      pcVar8 = cmMakefile::GetCMakeInstance(local_348);
      bVar4 = cmake::GetIsInTryCompile(pcVar8);
      if (!bVar4) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&processingOption,"CMAKE_POLICY_WARNING_CMP0156",
                   (allocator<char> *)&errorMessage);
        bVar4 = cmMakefile::PolicyOptionalWarningEnabled(local_348,(string *)&processingOption);
        std::__cxx11::string::~string((string *)&processingOption);
        if (bVar4) {
          pcVar8 = cmMakefile::GetCMakeInstance(local_348);
          cmPolicies::GetPolicyWarning_abi_cxx11_(&errorMessage,(cmPolicies *)0x9c,id_00);
          cmStrCat<std::__cxx11::string,char_const(&)[88]>
                    ((string *)&processingOption,&errorMessage,
                     (char (*) [88])
                     "\nSince the policy is not set, legacy libraries de-duplication strategy will be applied."
                    );
          cmGeneratorTarget::GetBacktrace((cmGeneratorTarget *)local_310);
          cmake::IssueMessage(pcVar8,AUTHOR_WARNING,(string *)&processingOption,
                              (cmListFileBacktrace *)local_310);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_310 + 8));
          std::__cxx11::string::~string((string *)&processingOption);
          std::__cxx11::string::~string((string *)&errorMessage);
        }
      }
      goto LAB_0057782f;
    }
    if (PVar6 != NEW) goto LAB_0057782f;
  }
  local_2a0._24_8_ = &local_340->LinkLanguage;
  cmStrCat<char_const(&)[7],std::__cxx11::string_const&,char_const(&)[27]>
            ((string *)&processingOption,(char (*) [7])0x7a0538,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2a0._24_8_,
             (char (*) [27])"_LINK_LIBRARIES_PROCESSING");
  cVar7 = cmMakefile::GetDefinition(local_348,(string *)&processingOption);
  std::__cxx11::string::~string((string *)&processingOption);
  if (cVar7.Value != (string *)0x0) {
    cmsys::RegularExpression::RegularExpression
              (&processingOption,"^(ORDER|UNICITY)=(FORWARD|REVERSE|ALL|NONE|SHARED)$");
    errorMessage._M_dataplus._M_p = (pointer)&errorMessage.field_2;
    errorMessage._M_string_length = 0;
    errorMessage.field_2._M_local_buf[0] = '\0';
    std::__cxx11::string::string((string *)local_310,(string *)cVar7.Value);
    init._M_len = 1;
    init._M_array = (iterator)local_310;
    cmList::cmList((cmList *)local_2a0,init);
    std::__cxx11::string::~string((string *)local_310);
    for (s = (cmMakefile *)local_2a0._0_8_; s != (cmMakefile *)local_2a0._8_8_;
        s = (cmMakefile *)
            &(s->FindPackageRootPathStack).
             super__Deque_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
             ._M_impl.super__Deque_impl_data._M_start._M_last) {
      bVar4 = cmsys::RegularExpression::find(&processingOption,(string *)s);
      if (bVar4) {
        cmsys::RegularExpressionMatch::match_abi_cxx11_
                  ((string *)local_310,&processingOption.regmatch,1);
        bVar4 = std::operator==((string *)local_310,"ORDER");
        std::__cxx11::string::~string((string *)local_310);
        if (bVar4) {
          cmsys::RegularExpressionMatch::match_abi_cxx11_
                    ((string *)local_310,&processingOption.regmatch,2);
          bVar4 = std::operator==((string *)local_310,"FORWARD");
          std::__cxx11::string::~string((string *)local_310);
          if (bVar4) {
            entriesProcessing._0_8_ = entriesProcessing._0_8_ & 0xffffffff00000000;
          }
          else {
            cmsys::RegularExpressionMatch::match_abi_cxx11_
                      ((string *)local_310,&processingOption.regmatch,2);
            bVar4 = std::operator==((string *)local_310,"REVERSE");
            std::__cxx11::string::~string((string *)local_310);
            if (!bVar4) {
              local_349 = '\n';
              cmStrCat<char_const(&)[3],std::__cxx11::string_const&,char>
                        ((string *)local_310,(char (*) [3])0x7840d1,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)s,
                         &local_349);
              std::__cxx11::string::append((string *)&errorMessage);
              goto LAB_00577545;
            }
            entriesProcessing.Order = Reverse;
          }
        }
        else {
          cmsys::RegularExpressionMatch::match_abi_cxx11_
                    ((string *)local_310,&processingOption.regmatch,1);
          bVar4 = std::operator==((string *)local_310,"UNICITY");
          std::__cxx11::string::~string((string *)local_310);
          if (bVar4) {
            cmsys::RegularExpressionMatch::match_abi_cxx11_
                      ((string *)local_310,&processingOption.regmatch,2);
            bVar4 = std::operator==((string *)local_310,"ALL");
            std::__cxx11::string::~string((string *)local_310);
            if (bVar4) {
              entriesProcessing.Unicity = All;
            }
            else {
              cmsys::RegularExpressionMatch::match_abi_cxx11_
                        ((string *)local_310,&processingOption.regmatch,2);
              bVar4 = std::operator==((string *)local_310,"NONE");
              std::__cxx11::string::~string((string *)local_310);
              if (bVar4) {
                entriesProcessing._0_8_ = entriesProcessing._0_8_ & 0xffffffff;
              }
              else {
                cmsys::RegularExpressionMatch::match_abi_cxx11_
                          ((string *)local_310,&processingOption.regmatch,2);
                bVar4 = std::operator==((string *)local_310,"SHARED");
                std::__cxx11::string::~string((string *)local_310);
                if (!bVar4) {
                  local_349 = '\n';
                  cmStrCat<char_const(&)[3],std::__cxx11::string_const&,char>
                            ((string *)local_310,(char (*) [3])0x7840d1,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)s,
                             &local_349);
                  std::__cxx11::string::append((string *)&errorMessage);
                  goto LAB_00577545;
                }
                entriesProcessing.Unicity = Shared;
              }
            }
          }
        }
      }
      else {
        local_349 = '\n';
        cmStrCat<char_const(&)[3],std::__cxx11::string_const&,char>
                  ((string *)local_310,(char (*) [3])0x7840d1,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)s,&local_349
                  );
        std::__cxx11::string::append((string *)&errorMessage);
LAB_00577545:
        std::__cxx11::string::~string((string *)local_310);
      }
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_2a0);
    if (errorMessage._M_string_length != 0) {
      pcVar8 = cmMakefile::GetCMakeInstance(local_348);
      cmStrCat<char_const(&)[32],std::__cxx11::string_const&,char_const(&)[30],std::__cxx11::string&>
                ((string *)local_310,(char (*) [32])"Erroneous option(s) for \'CMAKE_",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_2a0._24_8_,(char (*) [30])"_LINK_LIBRARIES_PROCESSING\':\n",&errorMessage);
      cmGeneratorTarget::GetBacktrace((cmGeneratorTarget *)local_2a0);
      cmake::IssueMessage(pcVar8,FATAL_ERROR,(string *)local_310,(cmListFileBacktrace *)local_2a0);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_2a0 + 8));
      std::__cxx11::string::~string((string *)local_310);
    }
    std::__cxx11::string::~string((string *)&errorMessage);
    cmsys::RegularExpression::~RegularExpression(&processingOption);
  }
LAB_0057782f:
  if ((local_340->GroupItems)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    entriesProcessing.Groups = &local_340->GroupItems;
    pmVar3 = &local_340->GroupItems;
    for (p_Var9 = (local_340->GroupItems)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var9 != &(pmVar3->_M_t)._M_impl.super__Rb_tree_header;
        p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9)) {
      p_Var2 = p_Var9[1]._M_left;
      for (p_Var16 = p_Var9[1]._M_parent; p_Var16 != p_Var2;
          p_Var16 = (_Base_ptr)&p_Var16->_M_parent) {
        processingOption.regmatch.startp[0] = *(char **)p_Var16;
        std::
        _Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
        ::_M_insert_unique<unsigned_long_const&>
                  ((_Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
                    *)&entriesProcessing.Emitted,(unsigned_long *)&processingOption);
      }
    }
  }
  if (entriesProcessing.Order == Reverse) {
    puVar14 = (local_340->FinalLinkOrder).
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start;
    for (puVar17 = (local_340->FinalLinkOrder).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_finish; puVar17 != puVar14; puVar17 = puVar17 + -1) {
      processingOption.regmatch.startp[0] = (char *)puVar17[-1];
      pLVar19 = ((entriesProcessing.Entries)->
                super__Vector_base<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
                )._M_impl.super__Vector_impl_data._M_start +
                (long)processingOption.regmatch.startp[0];
      bVar4 = anon_unknown.dwarf_222da09::EntriesProcessing::IncludeEntry
                        (&entriesProcessing,pLVar19);
      if ((bVar4) ||
         (pVar20 = std::
                   _Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
                   ::_M_insert_unique<unsigned_long_const&>
                             ((_Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
                               *)&entriesProcessing.Emitted,(unsigned_long *)&processingOption),
         ((undefined1  [16])pVar20 & (undefined1  [16])0x1) != (undefined1  [16])0x0)) {
        std::vector<cmComputeLinkDepends::LinkEntry,std::allocator<cmComputeLinkDepends::LinkEntry>>
        ::emplace_back<cmComputeLinkDepends::LinkEntry_const&>
                  ((vector<cmComputeLinkDepends::LinkEntry,std::allocator<cmComputeLinkDepends::LinkEntry>>
                    *)entriesProcessing.FinalEntries,pLVar19);
      }
    }
  }
  else {
    puVar17 = (local_340->FinalLinkOrder).
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish;
    for (puVar14 = (local_340->FinalLinkOrder).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start; puVar14 != puVar17; puVar14 = puVar14 + 1) {
      processingOption.regmatch.startp[0] = (char *)*puVar14;
      pLVar19 = ((entriesProcessing.Entries)->
                super__Vector_base<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
                )._M_impl.super__Vector_impl_data._M_start +
                (long)processingOption.regmatch.startp[0];
      bVar4 = anon_unknown.dwarf_222da09::EntriesProcessing::IncludeEntry
                        (&entriesProcessing,pLVar19);
      if ((bVar4) ||
         (pVar20 = std::
                   _Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
                   ::_M_insert_unique<unsigned_long_const&>
                             ((_Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
                               *)&entriesProcessing.Emitted,(unsigned_long *)&processingOption),
         ((undefined1  [16])pVar20 & (undefined1  [16])0x1) != (undefined1  [16])0x0)) {
        std::vector<cmComputeLinkDepends::LinkEntry,std::allocator<cmComputeLinkDepends::LinkEntry>>
        ::emplace_back<cmComputeLinkDepends::LinkEntry_const&>
                  ((vector<cmComputeLinkDepends::LinkEntry,std::allocator<cmComputeLinkDepends::LinkEntry>>
                    *)entriesProcessing.FinalEntries,pLVar19);
      }
    }
  }
  puVar14 = (local_340->ObjectEntries).
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start;
  puVar17 = (local_340->ObjectEntries).
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (entriesProcessing.Order == Reverse) {
    for (; puVar17 != puVar14; puVar17 = puVar17 + -1) {
      std::vector<cmComputeLinkDepends::LinkEntry,std::allocator<cmComputeLinkDepends::LinkEntry>>::
      emplace_back<cmComputeLinkDepends::LinkEntry&>
                ((vector<cmComputeLinkDepends::LinkEntry,std::allocator<cmComputeLinkDepends::LinkEntry>>
                  *)entriesProcessing.FinalEntries,
                 ((entriesProcessing.Entries)->
                 super__Vector_base<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
                 )._M_impl.super__Vector_impl_data._M_start + puVar17[-1]);
    }
  }
  else {
    for (; puVar17 != puVar14; puVar17 = puVar17 + -1) {
      std::vector<cmComputeLinkDepends::LinkEntry,std::allocator<cmComputeLinkDepends::LinkEntry>>::
      _M_emplace_aux<cmComputeLinkDepends::LinkEntry&>
                ((vector<cmComputeLinkDepends::LinkEntry,std::allocator<cmComputeLinkDepends::LinkEntry>>
                  *)entriesProcessing.FinalEntries,
                 ((entriesProcessing.FinalEntries)->
                 super__Vector_base<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
                 )._M_impl.super__Vector_impl_data._M_start,
                 ((entriesProcessing.Entries)->
                 super__Vector_base<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
                 )._M_impl.super__Vector_impl_data._M_start + puVar17[-1]);
    }
  }
  if (entriesProcessing.Order == Reverse) {
    std::
    __reverse<__gnu_cxx::__normal_iterator<cmComputeLinkDepends::LinkEntry*,std::vector<cmComputeLinkDepends::LinkEntry,std::allocator<cmComputeLinkDepends::LinkEntry>>>>
              (((entriesProcessing.FinalEntries)->
               super__Vector_base<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
               )._M_impl.super__Vector_impl_data._M_start,
               ((entriesProcessing.FinalEntries)->
               super__Vector_base<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
               )._M_impl.super__Vector_impl_data._M_finish);
  }
  if (entriesProcessing.Groups ==
      (map<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
       *)0x0) {
LAB_00577bfc:
    if (local_340->DebugMode == true) {
      DisplayFinalEntries(local_340);
    }
    std::
    _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
    ::~_Rb_tree(&entriesProcessing.Emitted._M_t);
    return (vector<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
            *)(_Base_ptr)local_2a0._32_8_;
  }
  pcVar10 = (cmGeneratorTarget *)
            ((entriesProcessing.Groups)->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  local_338 = (cmGeneratorTarget *)&((entriesProcessing.Groups)->_M_t)._M_impl.super__Rb_tree_header
  ;
LAB_00577a57:
  if (pcVar10 != local_338) {
    __x = ((entriesProcessing.Entries)->
          super__Vector_base<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
          )._M_impl.super__Vector_impl_data._M_start +
          (long)(pcVar10->ObjectDirectory)._M_dataplus._M_p;
    __rhs._M_current =
         ((entriesProcessing.FinalEntries)->
         super__Vector_base<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
         )._M_impl.super__Vector_impl_data._M_start;
    do {
      local_348 = (cmMakefile *)
                  ((entriesProcessing.FinalEntries)->
                  super__Vector_base<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
                  )._M_impl.super__Vector_impl_data._M_finish;
      lVar15 = (long)local_348 - (long)__rhs._M_current;
      for (lVar18 = lVar15 / 0x68 >> 2; 0 < lVar18; lVar18 = lVar18 + -1) {
        _Var5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )__x,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)__rhs._M_current);
        __position._M_current = __rhs._M_current;
        if (_Var5) goto LAB_00577b72;
        __position._M_current =
             (LinkEntry *)
             ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)&(((cmMakefile *)__rhs._M_current)->CMP0054ReportedIds)._M_t._M_impl.
                  super__Rb_tree_header + 1);
        _Var5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )__x,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)__position._M_current);
        if (_Var5) goto LAB_00577b72;
        __position._M_current =
             (LinkEntry *)
             &(((cmMakefile *)__rhs._M_current)->AliasTargets)._M_t._M_impl.super__Rb_tree_header.
              _M_header._M_left;
        _Var5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )__x,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)__position._M_current);
        if (_Var5) goto LAB_00577b72;
        __position._M_current =
             (LinkEntry *)
             &(((cmMakefile *)__rhs._M_current)->SourceFileSearchIndex)._M_h._M_rehash_policy;
        _Var5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )__x,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)__position._M_current);
        if (_Var5) goto LAB_00577b72;
        __rhs._M_current =
             (LinkEntry *)
             &(((cmMakefile *)__rhs._M_current)->Tests)._M_t._M_impl.super__Rb_tree_header._M_header
              ._M_left;
        lVar15 = lVar15 + -0x1a0;
      }
      lVar15 = lVar15 / 0x68;
      if (lVar15 == 1) {
LAB_00577b5c:
        _Var5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )__x,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)__rhs._M_current);
        __position._M_current = (LinkEntry *)local_348;
        if (_Var5) {
          __position._M_current = __rhs._M_current;
        }
      }
      else if (lVar15 == 2) {
LAB_00577b3d:
        _Var5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )__x,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)__rhs._M_current);
        __position._M_current = __rhs._M_current;
        if (!_Var5) {
          __rhs._M_current =
               (LinkEntry *)
               ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)&(((cmMakefile *)__rhs._M_current)->CMP0054ReportedIds)._M_t._M_impl.
                    super__Rb_tree_header + 1);
          goto LAB_00577b5c;
        }
      }
      else {
        __position._M_current = (LinkEntry *)local_348;
        if ((lVar15 == 3) &&
           (_Var5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)__x,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)__rhs._M_current),
           __position._M_current = __rhs._M_current, !_Var5)) {
          __rhs._M_current =
               (LinkEntry *)
               ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)&(((cmMakefile *)__rhs._M_current)->CMP0054ReportedIds)._M_t._M_impl.
                    super__Rb_tree_header + 1);
          goto LAB_00577b3d;
        }
      }
LAB_00577b72:
      if ((cmMakefile *)__position._M_current ==
          (cmMakefile *)
          ((entriesProcessing.FinalEntries)->
          super__Vector_base<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
          )._M_impl.super__Vector_impl_data._M_finish) goto LAB_00577bec;
      std::__cxx11::string::assign((char *)__position._M_current);
      for (sVar13 = (pcVar10->ObjectDirectory).field_2._M_allocated_capacity;
          sVar13 != (pcVar10->ObjectDirectory)._M_string_length; sVar13 = sVar13 - 8) {
        __position = std::
                     vector<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
                     ::insert(entriesProcessing.FinalEntries,__position._M_current,
                              ((entriesProcessing.Entries)->
                              super__Vector_base<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
                              )._M_impl.super__Vector_impl_data._M_start + *(long *)(sVar13 - 8));
      }
      __rhs = std::
              vector<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
              ::insert(entriesProcessing.FinalEntries,__position._M_current,__x);
      std::__cxx11::string::assign((char *)__rhs._M_current);
    } while( true );
  }
  goto LAB_00577bfc;
LAB_00577bec:
  pcVar10 = (cmGeneratorTarget *)std::_Rb_tree_increment((_Rb_tree_node_base *)pcVar10);
  goto LAB_00577a57;
}

Assistant:

std::vector<cmComputeLinkDepends::LinkEntry> const&
cmComputeLinkDepends::Compute()
{
  // Follow the link dependencies of the target to be linked.
  this->AddDirectLinkEntries();

  // Complete the breadth-first search of dependencies.
  while (!this->BFSQueue.empty()) {
    // Get the next entry.
    BFSEntry qe = this->BFSQueue.front();
    this->BFSQueue.pop();

    // Follow the entry's dependencies.
    this->FollowLinkEntry(qe);
  }

  // Complete the search of shared library dependencies.
  while (!this->SharedDepQueue.empty()) {
    // Handle the next entry.
    this->HandleSharedDependency(this->SharedDepQueue.front());
    this->SharedDepQueue.pop();
  }

  // Infer dependencies of targets for which they were not known.
  this->InferDependencies();

  // finalize groups dependencies
  // All dependencies which are raw items must be replaced by the group
  // it belongs to, if any.
  this->UpdateGroupDependencies();

  // Cleanup the constraint graph.
  this->CleanConstraintGraph();

  // Display the constraint graph.
  if (this->DebugMode) {
    fprintf(stderr,
            "---------------------------------------"
            "---------------------------------------\n");
    fprintf(stderr, "Link dependency analysis for target %s, config %s\n",
            this->Target->GetName().c_str(),
            this->HasConfig ? this->Config.c_str() : "noconfig");
    this->DisplayConstraintGraph();
  }

  // Compute the DAG of strongly connected components.  The algorithm
  // used by cmComputeComponentGraph should identify the components in
  // the same order in which the items were originally discovered in
  // the BFS.  This should preserve the original order when no
  // constraints disallow it.
  this->CCG =
    cm::make_unique<cmComputeComponentGraph>(this->EntryConstraintGraph);
  this->CCG->Compute();

  if (!this->CheckCircularDependencies()) {
    return this->FinalLinkEntries;
  }

  // Compute the final ordering.
  this->OrderLinkEntries();

  // Compute the final set of link entries.
  EntriesProcessing entriesProcessing{ this->Target, this->LinkLanguage,
                                       this->EntryList,
                                       this->FinalLinkEntries };
  // Add groups first, to ensure that libraries of the groups are always kept.
  entriesProcessing.AddGroups(this->GroupItems);
  entriesProcessing.AddLibraries(this->FinalLinkOrder);
  entriesProcessing.AddObjects(this->ObjectEntries);
  entriesProcessing.Finalize();

  // Display the final set.
  if (this->DebugMode) {
    this->DisplayFinalEntries();
  }

  return this->FinalLinkEntries;
}